

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O2

void SkipExpectedString(FILE *in,char *str)

{
  char cVar1;
  uint uVar2;
  
  do {
    if (*str == '\0') {
      return;
    }
    uVar2 = getc((FILE *)in);
    cVar1 = *str;
    str = str + 1;
  } while (uVar2 == (int)cVar1);
  fprintf(_stderr,"unexpected character \'%c\'\n",(ulong)uVar2);
  exit(1);
}

Assistant:

static void
SkipExpectedString(FILE* in, char* str)
{
    int c;
    while (*str != '\0') {
        c = getc(in);
        if (c != *str) {
            fprintf(stderr, "unexpected character '%c'\n", c);
            exit(1);
        }
        str++;
    }
}